

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O2

double __thiscall
sector_t::NextLowestFloorAt
          (sector_t *this,double x,double y,double z,int flags,double steph,sector_t **resultsec,
          F3DFloor **resultffloor)

{
  F3DFloor *pFVar1;
  secplane_t *psVar2;
  sector_t *psVar3;
  sector_t *psVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  psVar3 = this;
  dVar7 = 3.4028234663852886e+38;
  while( true ) {
    dVar8 = (y * (psVar3->floorplane).normal.Y +
            (psVar3->floorplane).normal.X * x + (psVar3->floorplane).D) * (psVar3->floorplane).negiC
    ;
    for (uVar5 = 0; (psVar3->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != uVar5;
        uVar5 = uVar5 + 1) {
      pFVar1 = (psVar3->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar5];
      if ((~pFVar1->flags & 3) == 0) {
        psVar2 = (pFVar1->top).plane;
        dVar6 = ((psVar2->normal).Y * y + psVar2->D + (psVar2->normal).X * x) * psVar2->negiC;
        if ((dVar8 < dVar6) &&
           ((dVar6 <= z ||
            (((dVar6 < steph + z && ((flags & 8U) == 0)) &&
             (psVar2 = (pFVar1->bottom).plane,
             ((psVar2->normal).Y * y + (psVar2->normal).X * x + psVar2->D) * psVar2->negiC < z))))))
        {
          if (resultsec != (sector_t **)0x0) {
            *resultsec = psVar3;
          }
          if (resultffloor == (F3DFloor **)0x0) {
            return dVar6;
          }
          *resultffloor = pFVar1;
          return dVar6;
        }
      }
    }
    psVar4 = this;
    if (((flags & 0x10U) != 0) || (psVar4 = psVar3, (psVar3->planes[0].Flags & 0x1d0U) != 0x100))
    break;
    dVar6 = sectorPortals.Array[psVar3->Portals[0]].mPlaneZ;
    if (dVar7 <= dVar6) break;
    x = x + sectorPortals.Array[psVar3->Portals[0]].mDisplacement.X;
    y = y + sectorPortals.Array[psVar3->Portals[0]].mDisplacement.Y;
    psVar3 = P_PointInSector(x,y);
    dVar7 = dVar6;
  }
  if (resultffloor != (F3DFloor **)0x0) {
    *resultffloor = (F3DFloor *)0x0;
  }
  if (resultsec != (sector_t **)0x0) {
    *resultsec = psVar4;
  }
  return dVar8;
}

Assistant:

double sector_t::NextLowestFloorAt(double x, double y, double z, int flags, double steph, sector_t **resultsec, F3DFloor **resultffloor)
{
	sector_t *sec = this;
	double planeheight = FLT_MAX;
	while (true)
	{
		// Looking through planes from top to bottom
		unsigned numff = sec->e->XFloor.ffloors.Size();
		double realfloor = sec->floorplane.ZatPoint(x, y);
		for (unsigned i = 0; i < numff; ++i)
		{
			F3DFloor *ff = sec->e->XFloor.ffloors[i];


			// either with feet above the 3D floor or feet with less than 'stepheight' map units inside
			if ((ff->flags & (FF_EXISTS | FF_SOLID)) == (FF_EXISTS | FF_SOLID))
			{
				double ffz = ff->top.plane->ZatPoint(x, y);
				double ffb = ff->bottom.plane->ZatPoint(x, y);

				if (ffz > realfloor && (z >= ffz || (!(flags & FFCF_3DRESTRICT) && (ffb < z && ffz < z + steph))))
				{ // This floor is beneath our feet.
					if (resultsec) *resultsec = sec;
					if (resultffloor) *resultffloor = ff;
					return ffz;
				}
			}
		}
		if ((flags & FFCF_NOPORTALS) || sec->PortalBlocksMovement(sector_t::floor) || planeheight <= sec->GetPortalPlaneZ(floor))
		{ // Use sector's floor
			if (resultffloor) *resultffloor = NULL;
			if (resultsec) *resultsec = sec;
			return realfloor;
		}
		else
		{
			DVector2 pos = sec->GetPortalDisplacement(floor);
			x += pos.X;
			y += pos.Y;
			planeheight = sec->GetPortalPlaneZ(floor);
			sec = P_PointInSector(x, y);
		}
	}
}